

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

void __thiscall BloatyTest::CheckCSVConsistency(BloatyTest *this,int row_count)

{
  RollupOutput *pRVar1;
  pointer pbVar2;
  internal iVar3;
  bool bVar4;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int base;
  pointer pcVar5;
  char *in_R9;
  pointer pbVar6;
  char *pcVar7;
  string_view text;
  string_view text_00;
  int32_t val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cols;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rows;
  string csv_output;
  ostringstream stream;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_268;
  undefined1 local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  AssertHelper local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  int local_1ec;
  pointer local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined1 local_1d0 [32];
  undefined4 local_1b0;
  undefined1 local_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1ec = row_count;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d0._24_8_ = 0x50;
  local_1b0 = 2;
  local_1ac = 0;
  local_1d0._16_4_ = 1;
  bloaty::RollupOutput::Print
            ((this->output_)._M_t.
             super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
             ._M_t.
             super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
             .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl,
             (OutputOptions *)(local_1d0 + 0x10),(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  local_260 = (undefined1  [8])local_1d8;
  local_258 = local_1e0;
  local_250._M_local_buf[0] = '\n';
  absl::strings_internal::
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
  ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::operator()(&local_208,
               (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)&local_220,
               (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_260);
  pcVar7 = anon_var_dwarf_3dafcb + 0x11;
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)local_260,"\"\"","rows[rows.size() - 1]",
             (char (*) [1])(anon_var_dwarf_3dafcb + 0x11),
             local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = (local_258->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_240,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",0x72
               ,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_220);
  }
  else {
    if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_258,local_258);
    }
    pbVar6 = local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    pcVar5 = local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
    pbVar2 = local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar2->field_2) {
      operator_delete(pcVar5,(pbVar2->field_2)._M_allocated_capacity + 1);
    }
    local_220.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)local_208.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_208.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_240 = (undefined1  [8])((ulong)(uint)local_240._4_4_ << 0x20);
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)local_260,"rows.size()","0",(unsigned_long *)&local_220,(int *)local_240)
    ;
    if (local_260[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_220);
      if (local_258 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = anon_var_dwarf_3dafcb + 0x11;
      }
      else {
        pcVar7 = (local_258->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_240,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                 0x75,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_220);
    }
    else {
      if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_258,local_258);
      }
      local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((long)local_208.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_208.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_260,"rows.size() - 1","row_count",(unsigned_long *)&local_220,
                 &local_1ec);
      if (local_260[0] != (internal)0x0) {
        if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_258,local_258);
        }
        local_1e8 = local_208.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = true;
          pbVar6 = local_208.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (pbVar6->_M_dataplus)._M_p;
            local_260 = (undefined1  [8])pbVar6->_M_string_length;
            local_250._M_local_buf[0] = ',';
            absl::strings_internal::
            Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::
            ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::operator()(&local_220,
                         (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          *)local_240,
                         (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)local_260);
            if (!bVar4) {
              pRVar1 = (this->output_)._M_t.
                       super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                       .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl;
              local_240 = (undefined1  [8])
                          (((long)*(pointer *)
                                   ((long)&(pRVar1->source_names_).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   + 8) -
                            *(long *)&(pRVar1->source_names_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           >> 5) + 2);
              local_268._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_220.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_220.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
              base = (int)&local_268;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                        ((internal *)local_260,"output_->source_names().size() + 2","cols.size()",
                         (unsigned_long *)local_240,(unsigned_long *)&local_268);
              if (local_260[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_240);
                if (local_258 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = anon_var_dwarf_3dafcb + 0x11;
                }
                else {
                  pcVar5 = (local_258->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_268,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                           ,0x85,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_268,(Message *)local_240);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
                if (local_240 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_240 + 8))();
                }
                if (local_258 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_258;
                  __ptr_00 = local_258;
                  goto LAB_0017ad03;
                }
              }
              else {
                if (local_258 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_258,local_258);
                }
                text._M_str = (char *)local_260;
                text._M_len = (size_t)local_220.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus.
                                      _M_p;
                bVar4 = absl::numbers_internal::safe_strto32_base
                                  ((numbers_internal *)
                                   local_220.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length,
                                   text,(Nonnull<int32_t_*>)0xa,base);
                local_240[0] = bVar4;
                local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (bVar4) {
                  text_00._M_str = (char *)local_260;
                  text_00._M_len =
                       (size_t)local_220.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-2]._M_dataplus._M_p;
                  bVar4 = absl::numbers_internal::safe_strto32_base
                                    ((numbers_internal *)
                                     local_220.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-2]._M_string_length
                                     ,text_00,(Nonnull<int32_t_*>)0xa,base);
                  local_240[0] = bVar4;
                  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (bVar4) goto LAB_0017aa0a;
                  testing::Message::Message((Message *)&local_268);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_260,(internal *)local_240,
                             (AssertionResult *)"absl::SimpleAtoi(cols[cols.size() - 2], &out)",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_228,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                             ,0x87,(char *)local_260);
                  testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_268);
                }
                else {
                  testing::Message::Message((Message *)&local_268);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_260,(internal *)local_240,
                             (AssertionResult *)"absl::SimpleAtoi(cols[cols.size() - 1], &out)",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_228,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                             ,0x86,(char *)local_260);
                  testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_268);
                }
                testing::internal::AssertHelper::~AssertHelper(&local_228);
                if (local_260 != (undefined1  [8])&local_250) {
                  operator_delete((void *)local_260,
                                  CONCAT71(local_250._M_allocated_capacity._1_7_,
                                           local_250._M_local_buf[0]) + 1);
                }
                if (local_268._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_268._M_head_impl + 8))();
                }
                if (local_238 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_238;
                  __ptr_00 = local_238;
LAB_0017ad03:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,__ptr_00);
                }
              }
LAB_0017ad08:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_220);
              break;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_240,
                     &((this->output_)._M_t.
                       super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                       .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->
                      source_names_);
            local_260 = (undefined1  [8])&local_250;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"vmsize","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_260);
            if (local_260 != (undefined1  [8])&local_250) {
              operator_delete((void *)local_260,
                              CONCAT71(local_250._M_allocated_capacity._1_7_,
                                       local_250._M_local_buf[0]) + 1);
            }
            local_260 = (undefined1  [8])&local_250;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"filesize","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_260);
            if (local_260 != (undefined1  [8])&local_250) {
              operator_delete((void *)local_260,
                              CONCAT71(local_250._M_allocated_capacity._1_7_,
                                       local_250._M_local_buf[0]) + 1);
            }
            testing::internal::
            CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((internal *)local_260,"cols","expected_headers",&local_220,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_240);
            iVar3 = local_260[0];
            if (local_260[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_268);
              pcVar7 = anon_var_dwarf_3dafcb + 0x11;
              if (local_258 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = (local_258->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_228,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                         ,0x80,pcVar7);
              testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_268);
              testing::internal::AssertHelper::~AssertHelper(&local_228);
              if (local_268._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_268._M_head_impl + 8))();
              }
            }
            if (local_258 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_258,local_258);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_240);
            if (iVar3 == (internal)0x0) goto LAB_0017ad08;
LAB_0017aa0a:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_220);
            pbVar6 = pbVar6 + 1;
            bVar4 = false;
          } while (pbVar6 != local_1e8);
        }
        goto LAB_0017ab3c;
      }
      testing::Message::Message((Message *)&local_220);
      if (local_258 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = anon_var_dwarf_3dafcb + 0x11;
      }
      else {
        pcVar7 = (local_258->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_240,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                 0x77,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_240,(Message *)&local_220);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_240);
  if (local_220.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((local_220.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
  }
  if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_258,local_258);
  }
LAB_0017ab3c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0) {
    operator_delete(local_1e0,(ulong)(local_1d0._0_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CheckCSVConsistency(int row_count) {
    std::ostringstream stream;
    bloaty::OutputOptions options;
    options.output_format = bloaty::OutputFormat::kCSV;
    output_->Print(options, &stream);
    std::string csv_output = stream.str();

    std::vector<std::string> rows = absl::StrSplit(csv_output, '\n');
    // Output ends with a final '\n', trim this.
    ASSERT_EQ("", rows[rows.size() - 1]);
    rows.pop_back();

    ASSERT_GT(rows.size(), 0);  // There should be a header row.

    ASSERT_EQ(rows.size() - 1, row_count);
    bool first = true;
    for (const auto& row : rows) {
      std::vector<std::string> cols = absl::StrSplit(row, ',');
      if (first) {
        // header row should be: header1,header2,...,vmsize,filesize
        std::vector<std::string> expected_headers(output_->source_names());
        expected_headers.push_back("vmsize");
        expected_headers.push_back("filesize");
        ASSERT_EQ(cols, expected_headers);
        first = false;
      } else {
        // Final two columns should parse as integer.
        int out;
        ASSERT_EQ(output_->source_names().size() + 2, cols.size());
        ASSERT_TRUE(absl::SimpleAtoi(cols[cols.size() - 1], &out));
        ASSERT_TRUE(absl::SimpleAtoi(cols[cols.size() - 2], &out));
      }
    }
  }